

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  FILE *__stream;
  FILE *__stream_00;
  GLboolean GVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  undefined1 local_48 [8];
  GLContext ctx;
  GLenum err;
  char **argv_local;
  int argc_local;
  
  GVar2 = ParseArgs(argc + -1,argv + 1);
  if (GVar2 == '\x01') {
    fprintf(_stderr,"Usage: visualinfo [-h] [-display <display>] [-visual <id>]\n");
    fprintf(_stderr,"        -h: this screen\n");
    fprintf(_stderr,"        -display <display>: use given display\n");
    fprintf(_stderr,"        -visual <id>: use given visual\n");
    argv_local._4_4_ = 1;
  }
  else {
    InitContext((GLContext *)local_48);
    GVar2 = CreateContext((GLContext *)local_48);
    if (GVar2 == '\x01') {
      fprintf(_stderr,"Error: CreateContext failed\n");
      DestroyContext((GLContext *)local_48);
      argv_local._4_4_ = 1;
    }
    else {
      glewExperimental = 1;
      ctx.cmap._4_4_ = glewInit();
      __stream_00 = _stderr;
      __stream = _stdout;
      if (ctx.cmap._4_4_ == 0) {
        file = (FILE *)_stdout;
        uVar3 = glGetString(0x1f00);
        fprintf(__stream,"OpenGL vendor string: %s\n",uVar3);
        pFVar1 = file;
        uVar3 = glGetString(0x1f01);
        fprintf((FILE *)pFVar1,"OpenGL renderer string: %s\n",uVar3);
        pFVar1 = file;
        uVar3 = glGetString(0x1f02);
        fprintf((FILE *)pFVar1,"OpenGL version string: %s\n",uVar3);
        fprintf((FILE *)file,"OpenGL extensions (GL_): \n");
        pcVar4 = (char *)glGetString(0x1f03);
        PrintExtensions(pcVar4);
        fprintf((FILE *)file,"GLX extensions (GLX_): \n");
        uVar3 = (*___glewXGetCurrentDisplay)();
        lVar5 = (*___glewXGetCurrentDisplay)();
        pcVar4 = (char *)glXQueryExtensionsString(uVar3,*(undefined4 *)(lVar5 + 0xe0));
        PrintExtensions(pcVar4);
        VisualInfo((GLContext *)local_48);
        DestroyContext((GLContext *)local_48);
        if ((FILE *)file != _stdout) {
          fclose((FILE *)file);
        }
        argv_local._4_4_ = 0;
      }
      else {
        uVar3 = glewGetErrorString(ctx.cmap._4_4_);
        fprintf(__stream_00,"Error [main]: glewInit failed: %s\n",uVar3);
        DestroyContext((GLContext *)local_48);
        argv_local._4_4_ = 1;
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int 
main (int argc, char** argv)
{
  GLenum err;
  GLContext ctx;

  /* ---------------------------------------------------------------------- */
  /* parse arguments */
  if (GL_TRUE == ParseArgs(argc-1, argv+1))
  {
#if defined(_WIN32)
    fprintf(stderr, "Usage: visualinfo [-a] [-s] [-h] [-pf <id>]\n");
    fprintf(stderr, "        -a: show all visuals\n");
    fprintf(stderr, "        -s: display to stdout instead of visualinfo.txt\n");
    fprintf(stderr, "        -pf <id>: use given pixelformat\n");
    fprintf(stderr, "        -h: this screen\n");
#else
    fprintf(stderr, "Usage: visualinfo [-h] [-display <display>] [-visual <id>]\n");
    fprintf(stderr, "        -h: this screen\n");
    fprintf(stderr, "        -display <display>: use given display\n");
    fprintf(stderr, "        -visual <id>: use given visual\n");
#endif
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* create OpenGL rendering context */
  InitContext(&ctx);
  if (GL_TRUE == CreateContext(&ctx))
  {
    fprintf(stderr, "Error: CreateContext failed\n");
    DestroyContext(&ctx);
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* initialize GLEW */
  glewExperimental = GL_TRUE;
#ifdef GLEW_MX
  err = glewContextInit(glewGetContext());
#  ifdef _WIN32
  err = err || wglewContextInit(wglewGetContext());
#  elif !defined(__APPLE__) && !defined(__HAIKU__) || defined(GLEW_APPLE_GLX)
  err = err || glxewContextInit(glxewGetContext());
#  endif
#else
  err = glewInit();
#endif
  if (GLEW_OK != err)
  {
    fprintf(stderr, "Error [main]: glewInit failed: %s\n", glewGetErrorString(err));
    DestroyContext(&ctx);
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* open file */
#if defined(_WIN32)
  if (!displaystdout)
  {
#if defined(_MSC_VER) && (_MSC_VER >= 1400)
    if (fopen_s(&file, "visualinfo.txt", "w") != 0)
      file = stdout;
#else
    file = fopen("visualinfo.txt", "w");
#endif
  }
  if (file == NULL)
    file = stdout;
#else
  file = stdout;
#endif

  /* ---------------------------------------------------------------------- */
  /* output header information */
  /* OpenGL extensions */
  fprintf(file, "OpenGL vendor string: %s\n", glGetString(GL_VENDOR));
  fprintf(file, "OpenGL renderer string: %s\n", glGetString(GL_RENDERER));
  fprintf(file, "OpenGL version string: %s\n", glGetString(GL_VERSION));
  fprintf(file, "OpenGL extensions (GL_): \n");
  PrintExtensions((const char*)glGetString(GL_EXTENSIONS));

#ifndef GLEW_NO_GLU
  /* GLU extensions */
  fprintf(file, "GLU version string: %s\n", gluGetString(GLU_VERSION));
  fprintf(file, "GLU extensions (GLU_): \n");
  PrintExtensions((const char*)gluGetString(GLU_EXTENSIONS));
#endif

  /* ---------------------------------------------------------------------- */
  /* extensions string */
#if defined(GLEW_OSMESA)
#elif defined(GLEW_EGL)
#elif defined(_WIN32)
  /* WGL extensions */
  if (WGLEW_ARB_extensions_string || WGLEW_EXT_extensions_string)
  {
    fprintf(file, "WGL extensions (WGL_): \n");
    PrintExtensions(wglGetExtensionsStringARB ? 
                    (const char*)wglGetExtensionsStringARB(ctx.dc) :
		    (const char*)wglGetExtensionsStringEXT());
  }
#elif defined(__APPLE__) && !defined(GLEW_APPLE_GLX)
  
#elif defined(__HAIKU__)

  /* TODO */

#else
  /* GLX extensions */
  fprintf(file, "GLX extensions (GLX_): \n");
  PrintExtensions(glXQueryExtensionsString(glXGetCurrentDisplay(), 
                                           DefaultScreen(glXGetCurrentDisplay())));
#endif

  /* ---------------------------------------------------------------------- */
  /* enumerate all the formats */
  VisualInfo(&ctx);

  /* ---------------------------------------------------------------------- */
  /* release resources */
  DestroyContext(&ctx);
  if (file != stdout)
    fclose(file);
  return 0;
}